

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

SUNErrCode SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pvVar8 = A->content;
  lVar10 = *(long *)((long)pvVar8 + 0x18);
  pvVar7 = B->content;
  lVar9 = *(long *)((long)pvVar7 + 0x18);
  if ((lVar9 < lVar10) || (*(long *)((long)pvVar7 + 0x20) < *(long *)((long)pvVar8 + 0x20))) {
    lVar11 = *(long *)((long)pvVar8 + 0x20);
    if (*(long *)((long)pvVar8 + 0x20) < *(long *)((long)pvVar7 + 0x20)) {
      lVar11 = *(long *)((long)pvVar7 + 0x20);
    }
    if (lVar10 < lVar9) {
      lVar10 = lVar9;
    }
    lVar9 = *(long *)((long)pvVar8 + 0x28);
    if (*(long *)((long)pvVar8 + 0x28) < *(long *)((long)pvVar7 + 0x28)) {
      lVar9 = *(long *)((long)pvVar7 + 0x28);
    }
    lVar1 = lVar11 + 1 + lVar9;
    *(long *)((long)pvVar7 + 0x18) = lVar10;
    *(long *)((long)pvVar7 + 0x20) = lVar11;
    *(long *)((long)pvVar7 + 0x28) = lVar9;
    *(long *)((long)pvVar7 + 0x10) = lVar1;
    lVar10 = *(long *)((long)pvVar7 + 8) * lVar1;
    *(long *)((long)pvVar7 + 0x38) = lVar10;
    pvVar7 = realloc(*(void **)((long)pvVar7 + 0x30),lVar10 * 8);
    pvVar8 = B->content;
    *(void **)((long)pvVar8 + 0x30) = pvVar7;
    if (0 < *(long *)((long)pvVar8 + 8)) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        *(long *)(*(long *)((long)pvVar8 + 0x40) + lVar9 * 8) =
             *(long *)((long)pvVar8 + 0x30) + lVar10;
        lVar9 = lVar9 + 1;
        pvVar8 = B->content;
        lVar10 = lVar10 + lVar1 * 8;
      } while (lVar9 < *(long *)((long)pvVar8 + 8));
    }
  }
  pvVar8 = B->content;
  if (0 < *(long *)((long)pvVar8 + 0x38)) {
    memset(*(void **)((long)pvVar8 + 0x30),0,*(long *)((long)pvVar8 + 0x38) << 3);
  }
  lVar10 = *(long *)((long)pvVar8 + 8);
  if (0 < lVar10) {
    lVar9 = *(long *)((long)pvVar8 + 0x28);
    lVar11 = *(long *)((long)pvVar8 + 0x40);
    pvVar8 = A->content;
    lVar1 = *(long *)((long)pvVar8 + 0x40);
    lVar2 = *(long *)((long)pvVar8 + 0x20);
    lVar3 = *(long *)((long)pvVar8 + 0x28);
    lVar4 = *(long *)((long)pvVar8 + 0x18);
    lVar12 = 0;
    do {
      if (-lVar4 <= lVar2) {
        lVar5 = *(long *)(lVar11 + lVar12 * 8);
        lVar6 = *(long *)(lVar1 + lVar12 * 8);
        lVar13 = -lVar4;
        do {
          *(undefined8 *)(lVar5 + lVar9 * 8 + lVar13 * 8) =
               *(undefined8 *)(lVar6 + lVar3 * 8 + lVar13 * 8);
          lVar13 = lVar13 + 1;
        } while (lVar2 + 1 != lVar13);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar10);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, colSize, ml, mu, smu;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Grow B if A's bandwidth is larger */
  if ((SM_UBAND_B(A) > SM_UBAND_B(B)) || (SM_LBAND_B(A) > SM_LBAND_B(B)))
  {
    ml                     = SUNMAX(SM_LBAND_B(B), SM_LBAND_B(A));
    mu                     = SUNMAX(SM_UBAND_B(B), SM_UBAND_B(A));
    smu                    = SUNMAX(SM_SUBAND_B(B), SM_SUBAND_B(A));
    colSize                = smu + ml + 1;
    SM_CONTENT_B(B)->mu    = mu;
    SM_CONTENT_B(B)->ml    = ml;
    SM_CONTENT_B(B)->s_mu  = smu;
    SM_CONTENT_B(B)->ldim  = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data =
      (sunrealtype*)realloc(SM_CONTENT_B(B)->data,
                            SM_COLUMNS_B(B) * colSize * sizeof(sunrealtype));
    for (j = 0; j < SM_COLUMNS_B(B); j++)
    {
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
    }
  }

  /* Perform operation */
  SUNCheckCall(SUNMatZero_Band(B));
  for (j = 0; j < SM_COLUMNS_B(B); j++)
  {
    B_colj = SM_COLUMN_B(B, j);
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { B_colj[i] = A_colj[i]; }
  }
  return SUN_SUCCESS;
}